

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O1

int sbisect(int np,poly *sseq,double min,double max,int atmin,int atmax,double *roots)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double local_68;
  double local_60;
  
  if (atmin - atmax == 1) {
    iVar1 = modrf(sseq->ord,sseq->coef,min,max,roots);
    if (iVar1 == 0) {
      iVar1 = 800;
      do {
        dVar6 = (max + min) * 0.5;
        iVar2 = numchanges(np,sseq,dVar6);
        dVar7 = max - min;
        if (1e-12 < ABS(dVar6)) {
          dVar7 = dVar7 / dVar6;
        }
        if (ABS(dVar7) < 1e-12) goto LAB_0015e79f;
        dVar7 = dVar6;
        if (iVar2 != atmin) {
          dVar7 = min;
          max = dVar6;
        }
        iVar1 = iVar1 + -1;
        min = dVar7;
      } while (iVar1 != 0);
      fprintf(_stderr,
              "sbisect: overflow min %f max %f\t\t\t\t\t\t\t                         diff %e nroot %d n1 %d n2 %d\n"
              ,dVar7,max,max - dVar7,1,0,0);
LAB_0015e79f:
      *roots = dVar6;
    }
  }
  else {
    iVar1 = 800;
    do {
      dVar6 = (max + min) * 0.5;
      iVar2 = numchanges(np,sseq,dVar6);
      uVar4 = atmin - iVar2;
      if (iVar2 - atmax != 0 && uVar4 != 0) {
        sbisect(np,sseq,min,dVar6,atmin,iVar2,roots);
        sbisect(np,sseq,dVar6,max,iVar2,atmax,roots + (int)uVar4);
        bVar5 = iVar1 == 0;
        local_68 = min;
        local_60 = max;
        goto LAB_0015e88b;
      }
      uVar4 = atmin - iVar2;
      dVar7 = dVar6;
      if (uVar4 != 0) {
        max = dVar6;
        dVar7 = min;
      }
      min = dVar7;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    bVar5 = true;
    local_68 = min;
    local_60 = max;
LAB_0015e88b:
    if (bVar5) {
      fwrite("sbisect: roots too close together\n",0x22,1,_stderr);
      fprintf(_stderr,
              "sbisect: overflow min %f max %f diff %e\t\t\t\t\t\t                      nroot %d n1 %d n2 %d\n"
              ,local_68,local_60,local_60 - local_68,(ulong)(uint)(atmin - atmax),(ulong)uVar4,
              (ulong)(uint)(iVar2 - atmax));
      if (atmax < atmin) {
        lVar3 = 0;
        do {
          roots[lVar3] = dVar6;
          lVar3 = lVar3 + 1;
        } while ((long)atmin - (long)atmax != lVar3);
      }
    }
  }
  return 1;
}

Assistant:

int sbisect(int np, poly *sseq,
	double min, double max,
	int atmin, int atmax,
	double *roots)
{
	double mid;
	int atmid;
	int its;
	int  n1 = 0, n2 = 0;
	int nroot = atmin - atmax;

	if (nroot == 1) {

		/* first try a less expensive technique.  */
		if (modrf(sseq->ord, sseq->coef, min, max, &roots[0]))
			return 1;

		/*
		* if we get here we have to evaluate the root the hard
		* way by using the Sturm sequence.
		*/
		for (its = 0; its < MAXIT; its++) {
			mid = (double)((min + max) / 2);
			atmid = numchanges(np, sseq, mid);

			if (fabs(mid) > RELERROR) {
				if (fabs((max - min) / mid) < RELERROR) {
					roots[0] = mid;
					return 1;
				}
			}
			else if (fabs(max - min) < RELERROR) {
				roots[0] = mid;
				return 1;
			}

			if ((atmin - atmid) == 0)
				min = mid;
			else
				max = mid;
		}

		if (its == MAXIT) {
			fprintf(stderr, "sbisect: overflow min %f max %f\
							                         diff %e nroot %d n1 %d n2 %d\n",
													 min, max, max - min, nroot, n1, n2);
			roots[0] = mid;
		}

		return 1;
	}

	/* more than one root in the interval, we have to bisect */
	for (its = 0; its < MAXIT; its++) {

		mid = (double)((min + max) / 2);
		atmid = numchanges(np, sseq, mid);

		n1 = atmin - atmid;
		n2 = atmid - atmax;

		if (n1 != 0 && n2 != 0) {
			sbisect(np, sseq, min, mid, atmin, atmid, roots);
			sbisect(np, sseq, mid, max, atmid, atmax, &roots[n1]);
			break;
		}

		if (n1 == 0)
			min = mid;
		else
			max = mid;
	}

	if (its == MAXIT) {
		fprintf(stderr, "sbisect: roots too close together\n");
		fprintf(stderr, "sbisect: overflow min %f max %f diff %e\
						                      nroot %d n1 %d n2 %d\n",
											  min, max, max - min, nroot, n1, n2);
		for (n1 = atmax; n1 < atmin; n1++)
			roots[n1 - atmax] = mid;
	}

	return 1;
}